

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Global * __thiscall wabt::Module::GetGlobal(Module *this,Var *var)

{
  Global *pGVar1;
  Var *var_local;
  Module *this_local;
  
  pGVar1 = GetGlobal(this,var);
  return pGVar1;
}

Assistant:

const Global* Module::GetGlobal(const Var& var) const {
  return const_cast<Module*>(this)->GetGlobal(var);
}